

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

string * __thiscall
QPDFWriter::getOriginalID1_abi_cxx11_(string *__return_storage_ptr__,QPDFWriter *this)

{
  bool bVar1;
  QPDFObjectHandle trailer;
  allocator<char> local_61;
  QPDFObjectHandle local_60;
  undefined1 local_50 [16];
  string local_40;
  QPDFObjectHandle local_20;
  
  QPDF::getTrailer((QPDF *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_50 + 0x10),"/ID",(allocator<char> *)&local_60);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_50,(string *)(local_50 + 0x10));
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 0x10),"/ID",&local_61);
    QPDFObjectHandle::getKey(&local_20,(string *)local_50);
    QPDFObjectHandle::getArrayItem(&local_60,(int)&local_20);
    QPDFObjectHandle::getStringValue_abi_cxx11_(__return_storage_ptr__,&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_20.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)(local_50 + 0x10));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)(local_50 + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFWriter::getOriginalID1()
{
    QPDFObjectHandle trailer = m->pdf.getTrailer();
    if (trailer.hasKey("/ID")) {
        return trailer.getKey("/ID").getArrayItem(0).getStringValue();
    } else {
        return "";
    }
}